

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.h
# Opt level: O2

void comp_mask_pred_16_ssse3(uint8_t *src0,uint8_t *src1,uint8_t *mask,uint8_t *dst)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 in_XMM0 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar17 = lddqu(in_XMM0,*(undefined1 (*) [16])src0);
  auVar20 = lddqu(in_XMM1,*(undefined1 (*) [16])src1);
  auVar19 = *(undefined1 (*) [16])mask;
  auVar27._0_14_ = auVar17._0_14_;
  auVar27[0xe] = auVar17[7];
  auVar27[0xf] = auVar20[7];
  auVar26._14_2_ = auVar27._14_2_;
  auVar26._0_13_ = auVar17._0_13_;
  auVar26[0xd] = auVar20[6];
  auVar25._13_3_ = auVar26._13_3_;
  auVar25._0_12_ = auVar17._0_12_;
  auVar25[0xc] = auVar17[6];
  auVar28._12_4_ = auVar25._12_4_;
  auVar28._0_11_ = auVar17._0_11_;
  auVar28[0xb] = auVar20[5];
  auVar24._11_5_ = auVar28._11_5_;
  auVar24._0_10_ = auVar17._0_10_;
  auVar24[10] = auVar17[5];
  auVar23._10_6_ = auVar24._10_6_;
  auVar23._0_9_ = auVar17._0_9_;
  auVar23[9] = auVar20[4];
  auVar22._9_7_ = auVar23._9_7_;
  auVar22._0_8_ = auVar17._0_8_;
  auVar22[8] = auVar17[4];
  auVar21._8_8_ = auVar22._8_8_;
  auVar21[7] = auVar20[3];
  auVar21[6] = auVar17[3];
  auVar21[5] = auVar20[2];
  auVar21[4] = auVar17[2];
  auVar21[3] = auVar20[1];
  auVar21[2] = auVar17[1];
  auVar21[0] = auVar17[0];
  auVar21[1] = auVar20[0];
  auVar36._0_14_ = auVar19._0_14_;
  auVar36[0xe] = auVar19[7];
  auVar36[0xf] = '@' - auVar19[7];
  auVar35._14_2_ = auVar36._14_2_;
  auVar35._0_13_ = auVar19._0_13_;
  auVar35[0xd] = '@' - auVar19[6];
  auVar34._13_3_ = auVar35._13_3_;
  auVar34._0_12_ = auVar19._0_12_;
  auVar34[0xc] = auVar19[6];
  auVar33._12_4_ = auVar34._12_4_;
  auVar33._0_11_ = auVar19._0_11_;
  auVar33[0xb] = '@' - auVar19[5];
  auVar32._11_5_ = auVar33._11_5_;
  auVar32._0_10_ = auVar19._0_10_;
  auVar32[10] = auVar19[5];
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_9_ = auVar19._0_9_;
  auVar31[9] = '@' - auVar19[4];
  auVar30._9_7_ = auVar31._9_7_;
  auVar30._0_8_ = auVar19._0_8_;
  auVar30[8] = auVar19[4];
  auVar29._8_8_ = auVar30._8_8_;
  auVar29[7] = '@' - auVar19[3];
  auVar29[6] = auVar19[3];
  auVar29[5] = '@' - auVar19[2];
  auVar29[4] = auVar19[2];
  auVar29[3] = '@' - auVar19[1];
  auVar29[2] = auVar19[1];
  auVar29[1] = '@' - auVar19[0];
  auVar29[0] = auVar19[0];
  auVar28 = pmaddubsw(auVar21,auVar29);
  auVar18[1] = auVar20[8];
  auVar18[0] = auVar17[8];
  auVar18[2] = auVar17[9];
  auVar18[3] = auVar20[9];
  auVar18[4] = auVar17[10];
  auVar18[5] = auVar20[10];
  auVar18[6] = auVar17[0xb];
  auVar18[7] = auVar20[0xb];
  auVar18[8] = auVar17[0xc];
  auVar18[9] = auVar20[0xc];
  auVar18[10] = auVar17[0xd];
  auVar18[0xb] = auVar20[0xd];
  auVar18[0xc] = auVar17[0xe];
  auVar18[0xd] = auVar20[0xe];
  auVar18[0xe] = auVar17[0xf];
  auVar18[0xf] = auVar20[0xf];
  auVar17[1] = '@' - auVar19[8];
  auVar17[0] = auVar19[8];
  auVar17[2] = auVar19[9];
  auVar17[3] = '@' - auVar19[9];
  auVar17[4] = auVar19[10];
  auVar17[5] = '@' - auVar19[10];
  auVar17[6] = auVar19[0xb];
  auVar17[7] = '@' - auVar19[0xb];
  auVar17[8] = auVar19[0xc];
  auVar17[9] = '@' - auVar19[0xc];
  auVar17[10] = auVar19[0xd];
  auVar17[0xb] = '@' - auVar19[0xd];
  auVar17[0xc] = auVar19[0xe];
  auVar17[0xd] = '@' - auVar19[0xe];
  auVar17[0xe] = auVar19[0xf];
  auVar17[0xf] = '@' - auVar19[0xf];
  auVar19 = pmaddubsw(auVar18,auVar17);
  auVar17 = pmulhrsw(auVar28,_DAT_00430240);
  auVar19 = pmulhrsw(auVar19,_DAT_00430240);
  sVar1 = auVar17._0_2_;
  sVar2 = auVar17._2_2_;
  sVar3 = auVar17._4_2_;
  sVar4 = auVar17._6_2_;
  sVar5 = auVar17._8_2_;
  sVar6 = auVar17._10_2_;
  sVar7 = auVar17._12_2_;
  sVar8 = auVar17._14_2_;
  sVar9 = auVar19._0_2_;
  sVar10 = auVar19._2_2_;
  sVar11 = auVar19._4_2_;
  sVar12 = auVar19._6_2_;
  sVar13 = auVar19._8_2_;
  sVar14 = auVar19._10_2_;
  sVar15 = auVar19._12_2_;
  sVar16 = auVar19._14_2_;
  *dst = (0 < sVar1) * (sVar1 < 0x100) * auVar17[0] - (0xff < sVar1);
  dst[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar17[2] - (0xff < sVar2);
  dst[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar17[4] - (0xff < sVar3);
  dst[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar17[6] - (0xff < sVar4);
  dst[4] = (0 < sVar5) * (sVar5 < 0x100) * auVar17[8] - (0xff < sVar5);
  dst[5] = (0 < sVar6) * (sVar6 < 0x100) * auVar17[10] - (0xff < sVar6);
  dst[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar17[0xc] - (0xff < sVar7);
  dst[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar17[0xe] - (0xff < sVar8);
  dst[8] = (0 < sVar9) * (sVar9 < 0x100) * auVar19[0] - (0xff < sVar9);
  dst[9] = (0 < sVar10) * (sVar10 < 0x100) * auVar19[2] - (0xff < sVar10);
  dst[10] = (0 < sVar11) * (sVar11 < 0x100) * auVar19[4] - (0xff < sVar11);
  dst[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar19[6] - (0xff < sVar12);
  dst[0xc] = (0 < sVar13) * (sVar13 < 0x100) * auVar19[8] - (0xff < sVar13);
  dst[0xd] = (0 < sVar14) * (sVar14 < 0x100) * auVar19[10] - (0xff < sVar14);
  dst[0xe] = (0 < sVar15) * (sVar15 < 0x100) * auVar19[0xc] - (0xff < sVar15);
  dst[0xf] = (0 < sVar16) * (sVar16 < 0x100) * auVar19[0xe] - (0xff < sVar16);
  return;
}

Assistant:

static inline void comp_mask_pred_16_ssse3(const uint8_t *src0,
                                           const uint8_t *src1,
                                           const uint8_t *mask, uint8_t *dst) {
  const __m128i alpha_max = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i round_offset =
      _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  const __m128i sA0 = _mm_lddqu_si128((const __m128i *)(src0));
  const __m128i sA1 = _mm_lddqu_si128((const __m128i *)(src1));
  const __m128i aA = _mm_load_si128((const __m128i *)(mask));

  const __m128i maA = _mm_sub_epi8(alpha_max, aA);

  const __m128i ssAL = _mm_unpacklo_epi8(sA0, sA1);
  const __m128i aaAL = _mm_unpacklo_epi8(aA, maA);
  const __m128i ssAH = _mm_unpackhi_epi8(sA0, sA1);
  const __m128i aaAH = _mm_unpackhi_epi8(aA, maA);

  const __m128i blendAL = _mm_maddubs_epi16(ssAL, aaAL);
  const __m128i blendAH = _mm_maddubs_epi16(ssAH, aaAH);

  const __m128i roundAL = _mm_mulhrs_epi16(blendAL, round_offset);
  const __m128i roundAH = _mm_mulhrs_epi16(blendAH, round_offset);
  _mm_store_si128((__m128i *)dst, _mm_packus_epi16(roundAL, roundAH));
}